

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv.hpp
# Opt level: O3

char * optflag(char ***argv,char *flagname,bool *flag)

{
  char **ppcVar1;
  char cVar2;
  int iVar3;
  char **ppcVar4;
  char *__s2;
  char *__s2_00;
  char *pcVar5;
  char temp_c_f [4];
  char temp_c_fno [8];
  char local_3c;
  char cStack_3b;
  undefined1 local_3a;
  char local_38;
  char cStack_37;
  undefined2 uStack_36;
  undefined2 local_34;
  
  ppcVar4 = *argv;
  pcVar5 = *ppcVar4;
  if (pcVar5 == (char *)0x0) {
    __assert_fail("*argv != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/cpp/argv.hpp"
                  ,0x62,"char *optflag(char **&, const char *, bool *)");
  }
  if (*flagname == '-') {
    cVar2 = flagname[1];
    if (cVar2 == 'f') {
      __s2 = "-fno-";
      __s2_00 = "-f";
    }
    else {
      if (cVar2 == '\0') {
        __assert_fail("flagname[1] != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/cpp/argv.hpp"
                      ,0x6d,"char *optflag(char **&, const char *, bool *)");
      }
      __s2_00 = &local_3c;
      local_3a = 0;
      __s2 = &local_38;
      local_34 = 0x2d;
      _local_3c = CONCAT11(cVar2,0x2d);
      _local_38 = CONCAT22(0x6f6e,CONCAT11(cVar2,0x2d));
    }
    flagname = flagname + 2;
  }
  else {
    __s2 = "-fno-";
    __s2_00 = "-f";
  }
  if ((flag != (bool *)0x0) && (iVar3 = strncmp(pcVar5,__s2,5), iVar3 == 0)) {
    *ppcVar4 = pcVar5 + 5;
    ppcVar4 = *argv;
    pcVar5 = *ppcVar4;
    if (pcVar5 == (char *)0x0) goto LAB_0017cfc0;
    iVar3 = strncmp(pcVar5,flagname,0x7fffffff);
    if (iVar3 == 0) {
      ppcVar1 = ppcVar4 + 1;
      *argv = ppcVar1;
      pcVar5 = *ppcVar4;
      if (pcVar5 != (char *)0x0) {
        *flag = false;
        return pcVar5;
      }
      pcVar5 = *ppcVar1;
      ppcVar4 = ppcVar1;
    }
    *ppcVar4 = pcVar5 + -5;
    ppcVar4 = *argv;
    pcVar5 = *ppcVar4;
  }
  iVar3 = strncmp(pcVar5,__s2_00,2);
  if (iVar3 == 0) {
    *ppcVar4 = pcVar5 + 2;
    ppcVar4 = *argv;
    pcVar5 = *ppcVar4;
    if (pcVar5 == (char *)0x0) {
LAB_0017cfc0:
      __assert_fail("*argv != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/cpp/argv.hpp"
                    ,0x1b,"char *optget(char **&, const char *, const char *, size_t)");
    }
    iVar3 = strncmp(pcVar5,flagname,0x7fffffff);
    if (iVar3 == 0) {
      ppcVar1 = ppcVar4 + 1;
      *argv = ppcVar1;
      pcVar5 = *ppcVar4;
      if (pcVar5 != (char *)0x0) {
        if (flag == (bool *)0x0) {
          return pcVar5;
        }
        *flag = true;
        return pcVar5;
      }
      pcVar5 = *ppcVar1;
      ppcVar4 = ppcVar1;
    }
    *ppcVar4 = pcVar5 + -2;
  }
  return (char *)0x0;
}

Assistant:

inline char* optflag(char**& argv, const char* flagname, bool* flag)
{
    assert(*argv != nullptr);

    char temp_c_f[4], temp_c_fno[8];
    const char* c_f   = "-f";
    const char* c_fno = "-fno-";

    // in case one wants to use e.g. -m instead of -f
    if(flagname[0] == '-')
    {
        if(flagname[1] != 'f')
        {
            assert(flagname[1] != 0);

            strcpy(temp_c_f, c_f);
            strcpy(temp_c_fno, c_fno);
            temp_c_f[1] = flagname[1];
            temp_c_fno[1] = flagname[1];

            c_f = temp_c_f;
            c_fno = temp_c_fno;
        }

        flagname += 2;
    }

    if(flag && !strncmp(*argv, c_fno, 5))
    {
        *argv += 5;
        if(char* val = optget(argv, nullptr, flagname, 0))
        {
            *flag = false;
            return val;
        }
        else
        {
            *argv -= 5;
        }
    }

    if(!strncmp(*argv, c_f, 2))
    {
        *argv += 2;
        if(char* val = optget(argv, nullptr, flagname, 0))
        {
            if(flag) *flag = true;
            return val;
        }
        else
        {
            *argv -= 2;
        }
    }

    return nullptr;
}